

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

void xmlFreeGlobalState(void *state)

{
  xmlGlobalState *gs;
  void *state_local;
  
  xmlResetError((xmlErrorPtr)((long)state + 0x10));
  return;
}

Assistant:

static void
xmlFreeGlobalState(void *state)
{
    xmlGlobalState *gs = (xmlGlobalState *) state;

    /*
     * Free any memory allocated in the thread's xmlLastError. If it
     * weren't for this indirect allocation, we wouldn't need
     * a destructor with thread-local storage at all!
     *
     * It would be nice if we could make xmlLastError a special error
     * type which uses statically allocated, fixed-size buffers.
     * But the xmlError struct is fully public and widely used,
     * so changes are dangerous.
     */
    xmlResetError(&gs->lastError);
#ifndef USE_TLS
    free(state);
#endif
}